

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::FunctionalTest20_21
          (FunctionalTest20_21 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"multiple_contexts",
             "Verifies that shader uniforms are preserved when rendering context is switched.");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020e3c68;
  this->m_program_pipelines[0] = 0;
  this->m_program_pipelines[1] = 0;
  this->m_program_pipelines[2] = 0;
  this->m_program_pipelines[3] = 0;
  this->m_program_pipelines[4] = 0;
  this->m_shared_contexts[0] = (RenderContext *)0x0;
  this->m_shared_contexts[1] = (RenderContext *)0x0;
  this->m_shared_contexts[2] = (RenderContext *)0x0;
  this->m_shared_contexts[3] = (RenderContext *)0x0;
  return;
}

Assistant:

FunctionalTest20_21::FunctionalTest20_21(deqp::Context& context)
	: TestCase(context, "multiple_contexts",
			   "Verifies that shader uniforms are preserved when rendering context is switched.")
{
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		m_program_pipelines[i] = 0;
	}

	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i] = 0;
	}
}